

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O3

Block * __thiscall
soul::StructuralParser::parseBracedBlock
          (StructuralParser *this,pool_ptr<soul::AST::Function> *ownerFunction)

{
  Scope *pSVar1;
  bool bVar2;
  Block *pBVar3;
  Context local_48;
  
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27e598);
  local_48.location.sourceCode.object = (this->super_SOULTokeniser).location.sourceCode.object;
  if (local_48.location.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_48.location.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_48.location.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_48.location.location.data = (this->super_SOULTokeniser).location.location.data;
  local_48.parentScope = this->currentScope;
  pBVar3 = PoolAllocator::
           allocate<soul::AST::Block,soul::AST::Context,soul::pool_ptr<soul::AST::Function>&>
                     (&this->allocator->pool,&local_48,ownerFunction);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_48.location.sourceCode.object);
  pSVar1 = this->currentScope;
  this->currentScope = &pBVar3->super_Scope;
  while( true ) {
    bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27cf28);
    if (bVar2) break;
    local_48.location.sourceCode.object = (SourceCodeText *)parseStatement(this);
    std::
    vector<soul::pool_ref<soul::AST::Statement>,std::allocator<soul::pool_ref<soul::AST::Statement>>>
    ::emplace_back<soul::pool_ref<soul::AST::Statement>>
              ((vector<soul::pool_ref<soul::AST::Statement>,std::allocator<soul::pool_ref<soul::AST::Statement>>>
                *)&pBVar3->statements,(pool_ref<soul::AST::Statement> *)&local_48);
  }
  this->currentScope = pSVar1;
  return pBVar3;
}

Assistant:

AST::Block& parseBracedBlock (pool_ptr<AST::Function> ownerFunction)
    {
        expect (Operator::openBrace);
        auto& newBlock = allocate<AST::Block> (getContext(), ownerFunction);
        ScopedScope scope (*this, newBlock);

        while (! matchIf (Operator::closeBrace))
            newBlock.addStatement (parseStatement());

        return newBlock;
    }